

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry>::grow
          (Vector<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::Entry> *this,
          size_t minCapacity)

{
  Entry *pEVar1;
  Entry *pEVar2;
  ulong uVar3;
  
  pEVar1 = (this->builder).endPtr;
  pEVar2 = (this->builder).ptr;
  uVar3 = 4;
  if (pEVar1 != pEVar2) {
    uVar3 = (((long)pEVar1 - (long)pEVar2) / 0x18) * 2;
  }
  if (minCapacity <= uVar3) {
    minCapacity = uVar3;
  }
  setCapacity(this,minCapacity);
  return;
}

Assistant:

inline size_t capacity() const { return endPtr - ptr; }